

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  int *piVar4;
  long lVar5;
  long *plVar6;
  size_t sVar7;
  undefined4 uVar11;
  size_t sVar8;
  void *pvVar9;
  void *pvVar10;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pointer piVar15;
  pointer piVar16;
  int iVar17;
  Layer *pLVar18;
  void *pvVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  void *pvVar23;
  int iVar24;
  size_t totalsize;
  long lVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  void *pvVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  size_type __n;
  uint uVar34;
  bool bVar35;
  float fVar36;
  long local_6e0;
  void *local_6d8;
  ulong local_6d0;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat bottom_blob_int8;
  undefined1 local_620 [16];
  size_t local_610;
  Allocator *local_608;
  undefined1 local_600 [16];
  size_t local_5f0;
  pointer local_5e8;
  int *piStack_5e0;
  pointer local_5d8;
  long *local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined1 local_5b0 [16];
  pointer local_5a0;
  long *plStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  ulong local_578;
  long local_570;
  Option opt_g_1;
  ParamDict pd;
  
  if (((bottom_blob->dims == 1) && (this->kernel_w == 1)) && (this->kernel_h == 1)) {
    iVar17 = this->weight_data_size / this->num_output;
    iVar22 = bottom_blob->w;
    if (iVar22 == iVar17) {
      pLVar18 = create_layer(0xf);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,this->num_output);
      ParamDict::set(&pd,1,this->bias_term);
      ParamDict::set(&pd,2,this->weight_data_size);
      ParamDict::set(&pd,8,this->int8_scale_term);
      pd.use_int8_inference._0_1_ = this->use_int8_inference;
      pd.use_int8_inference._1_3_ = 0;
      (*pLVar18->_vptr_Layer[2])(pLVar18);
      memset(&bottom_blob_int8,0,0xe0);
      if (&bottom_blob_int8 != &this->weight_data) {
        piVar4 = (this->weight_data).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        if (bottom_blob_int8.refcount != (int *)0x0) {
          LOCK();
          *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
          UNLOCK();
          if (*bottom_blob_int8.refcount == 0) {
            if (bottom_blob_int8.allocator == (Allocator *)0x0) {
              if (bottom_blob_int8.data != (void *)0x0) {
                free(*(void **)((long)bottom_blob_int8.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)bottom_blob_int8.allocator + 8))();
            }
          }
        }
        bottom_blob_int8.data = (this->weight_data).data;
        bottom_blob_int8.refcount = (this->weight_data).refcount;
        bottom_blob_int8.elemsize = (this->weight_data).elemsize;
        bottom_blob_int8.allocator = (this->weight_data).allocator;
        bottom_blob_int8.dims = (this->weight_data).dims;
        bottom_blob_int8.w = (this->weight_data).w;
        bottom_blob_int8.h = (this->weight_data).h;
        bottom_blob_int8.c = (this->weight_data).c;
        bottom_blob_int8.cstep = (this->weight_data).cstep;
      }
      if ((Mat *)local_620 != &this->bias_data) {
        piVar4 = (this->bias_data).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        if ((int *)local_620._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_620._8_8_ = *(int *)local_620._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_620._8_8_ == 0) {
            if (local_608 == (Allocator *)0x0) {
              if (local_620._0_8_ != 0) {
                free(*(void **)(local_620._0_8_ + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_608 + 8))();
            }
          }
        }
        local_620._0_8_ = (this->bias_data).data;
        local_620._8_8_ = (this->bias_data).refcount;
        local_610 = (this->bias_data).elemsize;
        local_608 = (this->bias_data).allocator;
        local_600._0_4_ = (this->bias_data).dims;
        local_600._4_4_ = (this->bias_data).w;
        local_600._8_4_ = (this->bias_data).h;
        local_600._12_4_ = (this->bias_data).c;
        local_5f0 = (this->bias_data).cstep;
      }
      if (this->int8_scale_term != 0) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&this->weight_data_int8_scale;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x4;
        if (piStack_5e0 != (int *)0x0) {
          LOCK();
          *piStack_5e0 = *piStack_5e0 + -1;
          UNLOCK();
          if (*piStack_5e0 == 0) {
            if (local_5d0 == (long *)0x0) {
              if (local_5e8 != (pointer)0x0) {
                free(*(void **)(local_5e8 + -2));
              }
            }
            else {
              (**(code **)(*local_5d0 + 8))();
            }
          }
        }
        local_5e8 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        piStack_5e0 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
        local_5d8 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_5d0 = (long *)0x0;
        local_5c8 = 0x100000002;
        uStack_5c0 = 0x100000004;
        local_5b8 = 4;
        if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish != (pointer)0x0) {
          LOCK();
          *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + -1;
          UNLOCK();
          if ((*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish == 0) &&
             (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0)) {
            free(*(void **)(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + -2));
          }
        }
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&this->bottom_blob_int8_scale;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x4;
        if ((int *)local_5b0._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_5b0._8_8_ = *(int *)local_5b0._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_5b0._8_8_ == 0) {
            if (plStack_598 == (long *)0x0) {
              if (local_5b0._0_8_ != 0) {
                free(*(void **)(local_5b0._0_8_ + -8));
              }
            }
            else {
              (**(code **)(*plStack_598 + 8))();
            }
          }
        }
        piVar15 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar16 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_5b0._0_8_ =
             _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_5b0._8_8_ =
             _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_5a0 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        plStack_598 = (long *)0x0;
        local_590 = 0x100000002;
        uStack_588 = 0x100000004;
        local_580 = 4;
        if (piVar16 != (pointer)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if ((*piVar16 == 0) && (piVar15 != (pointer)0x0)) {
            free(*(void **)(piVar15 + -2));
          }
        }
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
      }
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)&_space_ofs,&bottom_blob_int8);
      (*pLVar18->_vptr_Layer[3])(pLVar18,&_space_ofs);
      (*pLVar18->_vptr_Layer[5])(pLVar18,bottom_blob,top_blob,opt);
      (*pLVar18->_vptr_Layer[1])(pLVar18);
      lVar25 = 0xa8;
      do {
        piVar4 = *(int **)(local_620 + lVar25 + -0x30);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (*(long **)(local_620 + lVar25 + -0x20) == (long *)0x0) {
              if (*(long *)(local_620 + lVar25 + -0x38) != 0) {
                free(*(void **)(*(long *)(local_620 + lVar25 + -0x38) + -8));
              }
            }
            else {
              (**(code **)(**(long **)(local_620 + lVar25 + -0x20) + 8))();
            }
          }
        }
        *(undefined1 (*) [16])(local_620 + lVar25 + -0x38) = (undefined1  [16])0x0;
        *(undefined8 *)(local_620 + lVar25 + -0x28) = 0;
        *(undefined8 *)(local_620 + lVar25 + -8) = 0;
        *(undefined1 (*) [16])(local_620 + lVar25 + -0x18) = (undefined1  [16])0x0;
        lVar25 = lVar25 + -0x38;
      } while (lVar25 != -0x38);
      lVar25 = 0x4d8;
      do {
        piVar4 = *(int **)((long)pd.params + lVar25 + -8);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            lVar5 = *(long *)((long)pd.params + lVar25 + -0x10);
            plVar6 = *(long **)((long)&pd.params[0].v.data + lVar25);
            if (plVar6 == (long *)0x0) {
              if (lVar5 != 0) {
                free(*(void **)(lVar5 + -8));
              }
            }
            else {
              (**(code **)(*plVar6 + 8))();
            }
          }
        }
        *(undefined1 (*) [16])((long)pd.params + lVar25 + -0x10) = (undefined1  [16])0x0;
        *(undefined8 *)((long)&pd.params[0].loaded + lVar25) = 0;
        *(undefined8 *)((long)&pd.params[0].v.allocator + lVar25) = 0;
        *(undefined1 (*) [16])((long)&pd.params[0].v.refcount + lVar25) = (undefined1  [16])0x0;
        lVar25 = lVar25 + -0x40;
      } while (lVar25 != -0x28);
      if (iVar22 == iVar17) {
        return 0;
      }
    }
  }
  iVar22 = bottom_blob->w;
  iVar17 = bottom_blob->h;
  uVar1 = bottom_blob->c;
  uVar12 = bottom_blob->h;
  sVar7 = bottom_blob->elemsize;
  uVar34 = (this->kernel_w + -1) * this->dilation_w;
  uVar33 = (this->kernel_h + -1) * this->dilation_h;
  pd._0_8_ = bottom_blob->data;
  pd._8_8_ = bottom_blob->refcount;
  pd.params[0].v.data = bottom_blob->allocator;
  pd.params[0].v.refcount._0_4_ = bottom_blob->dims;
  if ((int *)pd._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)pd._8_8_ = *(int *)pd._8_8_ + 1;
    UNLOCK();
  }
  uVar3 = bottom_blob->w;
  uVar11 = bottom_blob->h;
  pd.params[0].v.elemsize._0_4_ = uVar11;
  pd.params[0].v.refcount._4_4_ = uVar3;
  pd.params[0].v.elemsize._4_4_ = bottom_blob->c;
  pd.params[0].v.allocator = (Allocator *)bottom_blob->cstep;
  iVar32 = 0;
  pd.params[0]._0_8_ = sVar7;
  if ((sVar7 != 1 & this->use_int8_inference) == 1) {
    bottom_blob_int8.allocator = opt->workspace_allocator;
    auVar14._4_4_ = -(uint)(uVar12 == 0);
    auVar14._0_4_ = -(uint)(iVar22 == 0);
    auVar14._8_4_ = -(uint)(uVar1 == 0);
    auVar14._12_4_ = 0;
    movmskps((int)&bottom_blob_int8.dims,auVar14 << 0x20);
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount = (int *)0x0;
    bottom_blob_int8.elemsize = 1;
    bottom_blob_int8.w = iVar22;
    bottom_blob_int8.dims = 3;
    bottom_blob_int8.h = iVar17;
    bottom_blob_int8.c = uVar1;
    bottom_blob_int8.cstep = (long)(iVar17 * iVar22) + 0xfU & 0xfffffffffffffff0;
    uVar26 = bottom_blob_int8.cstep * (long)(int)uVar1;
    if (uVar26 != 0) {
      if (bottom_blob_int8.allocator == (Allocator *)0x0) {
        pvVar19 = malloc(uVar26 + 0x1c);
        bottom_blob_int8.data = (void *)((long)pvVar19 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)bottom_blob_int8.data - 8) = pvVar19;
      }
      else {
        bottom_blob_int8.data =
             (void *)(*(code *)**(undefined8 **)bottom_blob_int8.allocator)
                               (bottom_blob_int8.allocator,uVar26 | 4);
      }
      bottom_blob_int8.refcount = (int *)((long)bottom_blob_int8.data + uVar26);
      *(undefined4 *)((long)bottom_blob_int8.data + uVar26) = 1;
    }
    if (bottom_blob_int8.data == (void *)0x0) {
      bVar35 = true;
    }
    else {
      bVar35 = (long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0;
    }
    iVar32 = -100;
    if (!bVar35) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)bottom_blob_int8.allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      (*this->quantize->_vptr_Layer[5])(this->quantize,bottom_blob);
      if (bottom_blob_int8.refcount != (int *)0x0) {
        LOCK();
        *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + 1;
        UNLOCK();
      }
      if (pd._8_8_ != 0) {
        LOCK();
        *(int *)pd._8_8_ = *(int *)pd._8_8_ + -1;
        UNLOCK();
        if (*(int *)pd._8_8_ == 0) {
          if (pd.params[0].v.data == (void *)0x0) {
            if (pd._0_8_ != 0) {
              free(*(void **)(pd._0_8_ + -8));
            }
          }
          else {
            (**(code **)(*pd.params[0].v.data + 8))();
          }
        }
      }
      iVar32 = 0;
      pd._0_8_ = bottom_blob_int8.data;
      pd._8_8_ = bottom_blob_int8.refcount;
      pd.params[0].loaded = (undefined4)bottom_blob_int8.elemsize;
      pd.params[0].field_1 =
           (anon_union_4_2_947300a4_for_anon_struct_64_3_9ed89b7b_1)bottom_blob_int8.elemsize._4_4_;
      pd.params[0].v.data = bottom_blob_int8.allocator;
      pd.params[0].v._8_16_ = bottom_blob_int8._32_16_;
      pd.params[0].v.allocator = (Allocator *)bottom_blob_int8.cstep;
    }
    if (bottom_blob_int8.refcount != (int *)0x0) {
      LOCK();
      *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
      UNLOCK();
      if (*bottom_blob_int8.refcount == 0) {
        if (bottom_blob_int8.allocator == (Allocator *)0x0) {
          if (bottom_blob_int8.data != (void *)0x0) {
            free(*(void **)((long)bottom_blob_int8.data + -8));
          }
        }
        else {
          (**(code **)(*(long *)bottom_blob_int8.allocator + 8))();
        }
      }
    }
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount = (int *)0x0;
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    if (bVar35) goto LAB_001357e3;
  }
  bottom_blob_int8.refcount = (int *)pd._8_8_;
  bottom_blob_int8.data = (void *)pd._0_8_;
  bottom_blob_int8.allocator = (Allocator *)pd.params[0].v.data;
  bottom_blob_int8.elemsize._0_4_ = pd.params[0].loaded;
  bottom_blob_int8.elemsize._4_4_ = pd.params[0].field_1;
  if (pd._8_8_ != 0) {
    LOCK();
    *(int *)pd._8_8_ = *(int *)pd._8_8_ + 1;
    UNLOCK();
  }
  bottom_blob_int8._32_16_ = pd.params[0].v._8_16_;
  bottom_blob_int8.cstep = (size_t)pd.params[0].v.allocator;
  iVar21 = this->pad_w;
  if ((iVar21 < 1) && (this->pad_h < 1)) {
    if (this->pad_h == -0xe9 && iVar21 == -0xe9) {
      iVar31 = uVar34 - (iVar22 + -1) % this->stride_w;
      iVar21 = uVar33 - (iVar17 + -1) % this->stride_h;
      if ((iVar31 < 1) && (iVar21 < 1)) {
LAB_00135556:
        bVar35 = true;
        iVar17 = bottom_blob_int8.h;
        iVar22 = bottom_blob_int8.w;
      }
      else {
        copy_make_border((Mat *)&pd,&bottom_blob_int8,iVar21 / 2,iVar21 - iVar21 / 2,iVar31 / 2,
                         iVar31 - iVar31 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        if (bottom_blob_int8.data == (void *)0x0) {
          bVar35 = false;
          iVar32 = -100;
        }
        else {
          if ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0) goto LAB_00135556;
          bVar35 = false;
          iVar32 = -100;
        }
      }
      if (!bVar35) goto LAB_00135782;
    }
LAB_0013516d:
    uVar26 = (long)(int)(~uVar34 + iVar22) / (long)this->stride_w;
    local_578 = uVar26 & 0xffffffff;
    uVar34 = (int)uVar26 + 1;
    iVar17 = (int)(~uVar33 + iVar17) / this->stride_h;
    Mat::create(top_blob,uVar34,iVar17 + 1,this->num_output,sVar7,opt->blob_allocator);
    iVar32 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar33 = this->kernel_w * this->kernel_h;
      __n = (size_type)(int)uVar33;
      std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&opt_g_1);
      if (0 < this->kernel_h) {
        iVar32 = this->dilation_h;
        iVar21 = this->dilation_w;
        iVar31 = this->kernel_w;
        iVar20 = 0;
        iVar24 = 0;
        iVar27 = 0;
        do {
          if (0 < this->kernel_w) {
            lVar25 = 0;
            do {
              _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar24 + lVar25] = iVar27;
              iVar27 = iVar27 + this->dilation_w;
              lVar25 = lVar25 + 1;
            } while ((int)lVar25 < this->kernel_w);
            iVar24 = iVar24 + (int)lVar25;
          }
          iVar27 = iVar27 + (iVar22 * iVar32 - iVar21 * iVar31);
          iVar20 = iVar20 + 1;
        } while (iVar20 < this->kernel_h);
      }
      uVar2 = this->num_output;
      if (this->use_int8_inference == false) {
        if (0 < (int)uVar2) {
          pvVar19 = top_blob->data;
          local_570 = top_blob->cstep * top_blob->elemsize;
          iVar22 = 0;
          local_6d0 = 0;
          do {
            if (-1 < iVar17) {
              pvVar23 = (void *)(local_570 * local_6d0 + (long)pvVar19);
              iVar32 = this->bias_term;
              pvVar9 = (this->weight_data).data;
              iVar21 = 0;
              do {
                if (-1 < (int)local_578) {
                  pvVar10 = (this->bias_data).data;
                  iVar31 = this->stride_h;
                  iVar20 = this->stride_w;
                  uVar26 = 0;
                  do {
                    if (iVar32 == 0) {
                      fVar36 = 0.0;
                    }
                    else {
                      fVar36 = *(float *)((long)pvVar10 + local_6d0 * 4);
                    }
                    if (0 < (int)uVar1) {
                      uVar28 = 0;
                      pvVar29 = (void *)((long)iVar22 * 4 + (long)pvVar9);
                      do {
                        if (0 < (int)uVar33) {
                          uVar30 = 0;
                          do {
                            fVar36 = fVar36 + *(float *)((long)pvVar29 + uVar30 * 4) *
                                              *(float *)((long)bottom_blob_int8.data +
                                                        (long)_space_ofs.
                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar30] *
                                                  4 + bottom_blob_int8.cstep *
                                                      bottom_blob_int8.elemsize * uVar28 +
                                                      uVar26 * (long)iVar20 * 4 +
                                                      (long)(bottom_blob_int8.w * iVar21 * iVar31) *
                                                      4);
                            uVar30 = uVar30 + 1;
                          } while (uVar33 != uVar30);
                        }
                        uVar28 = uVar28 + 1;
                        pvVar29 = (void *)((long)pvVar29 + __n * 4);
                      } while (uVar28 != uVar1);
                    }
                    *(float *)((long)pvVar23 + uVar26 * 4) = fVar36;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar34);
                }
                pvVar23 = (void *)((long)pvVar23 + (long)(int)uVar34 * 4);
                bVar35 = iVar21 != iVar17;
                iVar21 = iVar21 + 1;
              } while (bVar35);
            }
            local_6d0 = local_6d0 + 1;
            iVar22 = iVar22 + uVar33 * uVar1;
          } while (local_6d0 != uVar2);
        }
      }
      else {
        if (0 < (int)uVar2) {
          pvVar19 = top_blob->data;
          sVar7 = top_blob->cstep;
          sVar8 = top_blob->elemsize;
          local_6e0 = 0;
          do {
            if (-1 < iVar17) {
              local_6d8 = (void *)(sVar7 * sVar8 * local_6e0 + (long)pvVar19);
              pvVar23 = (this->weight_data).data;
              iVar22 = 0;
              do {
                if (-1 < (int)local_578) {
                  uVar26 = 0;
                  do {
                    if ((int)uVar1 < 1) {
                      iVar32 = 0;
                    }
                    else {
                      uVar28 = 0;
                      iVar32 = 0;
                      lVar25 = (long)(int)(uVar33 * uVar1 * (int)local_6e0) + (long)pvVar23;
                      do {
                        if (0 < (int)uVar33) {
                          uVar30 = 0;
                          do {
                            iVar32 = iVar32 + (int)*(char *)(lVar25 + uVar30) *
                                              (int)*(char *)((long)bottom_blob_int8.data +
                                                            (long)_space_ofs.
                                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar30] +
                                                  bottom_blob_int8.cstep * bottom_blob_int8.elemsize
                                                  * uVar28 +
                                                  (long)(bottom_blob_int8.w * iVar22 *
                                                        this->stride_h) +
                                                  (long)(int)uVar26 * (long)this->stride_w);
                            uVar30 = uVar30 + 1;
                          } while (uVar33 != uVar30);
                        }
                        lVar25 = lVar25 + __n;
                        uVar28 = uVar28 + 1;
                      } while (uVar28 != uVar1);
                    }
                    *(int *)((long)local_6d8 + uVar26 * 4) = iVar32;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar34);
                }
                local_6d8 = (void *)((long)local_6d8 + (long)(int)uVar34 * 4);
                bVar35 = iVar22 != iVar17;
                iVar22 = iVar22 + 1;
              } while (bVar35);
            }
            local_6e0 = local_6e0 + 1;
          } while (local_6e0 < this->num_output);
        }
        opt_g_1.workspace_allocator = opt->workspace_allocator;
        opt_g_1.lightmode = opt->lightmode;
        opt_g_1._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g_1.num_threads = opt->num_threads;
        opt_g_1.blob_allocator = top_blob->allocator;
        (*this->dequantize->_vptr_Layer[7])();
      }
      if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar32 = 0;
    }
  }
  else {
    copy_make_border((Mat *)&pd,&bottom_blob_int8,this->pad_h,this->pad_h,iVar21,iVar21,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
    iVar32 = -100;
    if ((bottom_blob_int8.data != (void *)0x0) &&
       ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) {
      iVar17 = bottom_blob_int8.h;
      iVar22 = bottom_blob_int8.w;
      goto LAB_0013516d;
    }
  }
LAB_00135782:
  if (bottom_blob_int8.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
    UNLOCK();
    if (*bottom_blob_int8.refcount == 0) {
      if (bottom_blob_int8.allocator == (Allocator *)0x0) {
        if (bottom_blob_int8.data != (void *)0x0) {
          free(*(void **)((long)bottom_blob_int8.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)bottom_blob_int8.allocator + 8))();
      }
    }
  }
  bottom_blob_int8._0_16_ = ZEXT816(0);
  bottom_blob_int8._32_16_ = ZEXT816(0);
LAB_001357e3:
  auVar13._8_8_ = 0;
  auVar13._0_8_ = bottom_blob_int8.allocator;
  bottom_blob_int8._16_16_ = auVar13 << 0x40;
  bottom_blob_int8.cstep = 0;
  if (pd._8_8_ != 0) {
    LOCK();
    *(int *)pd._8_8_ = *(int *)pd._8_8_ + -1;
    UNLOCK();
    if (*(int *)pd._8_8_ == 0) {
      if (pd.params[0].v.data == (void *)0x0) {
        if (pd._0_8_ != 0) {
          free(*(void **)(pd._0_8_ + -8));
        }
      }
      else {
        (**(code **)(*pd.params[0].v.data + 8))();
      }
    }
  }
  return iVar32;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            pd.use_int8_inference = use_int8_inference;

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = Mat(1, (size_t)4u, (void*)&weight_data_int8_scale);
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    if (use_int8_inference)
    {
        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int* outptr = top_blob.channel(p);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                    // channels
                    for (int q=0; q<channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            int val = sptr[ space_ofs[k] ];
                            int w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        // dequantize, reverse scale inplace
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = top_blob.allocator;

            dequantize->forward_inplace(top_blob, opt_g);
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}